

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O2

uint8_t __thiscall n_e_s::core::Ppu::read_byte(Ppu *this,uint16_t addr)

{
  byte bVar1;
  ushort uVar2;
  PpuRegisters *pPVar3;
  int iVar4;
  byte bVar5;
  undefined6 in_register_00000032;
  
  iVar4 = (int)CONCAT62(in_register_00000032,addr);
  if (iVar4 == 0x2007) {
    iVar4 = (*this->mmu_->_vptr_IMmu[3])
                      (this->mmu_,
                       (ulong)(this->registers_->vram_addr).super_Register<unsigned_short>.value_);
    bVar5 = (byte)iVar4;
    uVar2 = (this->registers_->vram_addr).super_Register<unsigned_short>.value_;
    if (uVar2 < 0x3f00) {
      bVar1 = this->read_buffer_;
      this->read_buffer_ = bVar5;
      bVar5 = bVar1;
    }
    else {
      iVar4 = (*this->mmu_->_vptr_IMmu[3])(this->mmu_,(ulong)(ushort)(uVar2 - 0x1000));
      this->read_buffer_ = (uint8_t)iVar4;
    }
    increment_vram_address(this);
  }
  else if (iVar4 == 0x2004) {
    bVar5 = this->oam_data_[this->registers_->oamaddr];
  }
  else {
    if (iVar4 != 0x2002) {
      iVar4 = (*this->mmu_->_vptr_IMmu[3])(this->mmu_,(ulong)addr);
      return (uint8_t)iVar4;
    }
    pPVar3 = this->registers_;
    bVar5 = (pPVar3->status).value_;
    pPVar3->write_toggle = false;
    (pPVar3->status).value_ = bVar5 & 0x7f;
  }
  return bVar5;
}

Assistant:

uint8_t Ppu::read_byte(uint16_t addr) {
    uint8_t byte = 0;

    if (addr == kPpuStatus) {
        byte = registers_->status.value();
        registers_->write_toggle = false;
        clear_vblank_flag();
    } else if (addr == kOamData) {
        byte = oam_data_[registers_->oamaddr];
    } else if (addr == kPpuData) {
        byte = mmu_->read_byte(registers_->vram_addr.value());
        if (registers_->vram_addr.value() < kFirstPaletteData) {
            const uint8_t tmp_buffer = read_buffer_;
            read_buffer_ = byte;
            byte = tmp_buffer;
        } else {
            read_buffer_ = mmu_->read_byte(registers_->vram_addr.value() -
                                           static_cast<uint16_t>(0x1000));
        }
        increment_vram_address();
    } else {
        byte = mmu_->read_byte(addr);
    }

    return byte;
}